

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint Hash::BOBHash32(uchar *str,uint len,uint num)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint c;
  uint b;
  uint a;
  uint num_local;
  uint len_local;
  uchar *str_local;
  
  b = 0x9e3779b9;
  a = 0x9e3779b9;
  c = prime[(ulong)num % 0x4cd];
  str_local = str;
  for (len_local = len; 0xb < len_local; len_local = len_local - 0xc) {
    iVar1 = (uint)str_local[4] + (uint)str_local[5] * 0x100 + (uint)str_local[6] * 0x10000 +
            (uint)str_local[7] * 0x1000000 + b;
    uVar2 = (uint)str_local[8] + (uint)str_local[9] * 0x100 + (uint)str_local[10] * 0x10000 +
            (uint)str_local[0xb] * 0x1000000 + c;
    uVar3 = uVar2 >> 0xd ^
            (((uint)*str_local + (uint)str_local[1] * 0x100 + (uint)str_local[2] * 0x10000 +
              (uint)str_local[3] * 0x1000000 + a) - iVar1) - uVar2;
    uVar4 = uVar3 << 8 ^ (iVar1 - uVar2) - uVar3;
    uVar2 = uVar4 >> 0xd ^ (uVar2 - uVar3) - uVar4;
    uVar3 = uVar2 >> 0xc ^ (uVar3 - uVar4) - uVar2;
    uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar2) - uVar3;
    uVar2 = uVar4 >> 5 ^ (uVar2 - uVar3) - uVar4;
    a = uVar2 >> 3 ^ (uVar3 - uVar4) - uVar2;
    b = a << 10 ^ (uVar4 - uVar2) - a;
    c = b >> 0xf ^ (uVar2 - a) - b;
    str_local = str_local + 0xc;
  }
  c = c + len_local;
  switch(len_local) {
  case 0xb:
    c = (uint)str_local[10] * 0x1000000 + c;
  case 10:
    c = (uint)str_local[9] * 0x10000 + c;
  case 9:
    c = (uint)str_local[8] * 0x100 + c;
  case 8:
    b = (uint)str_local[7] * 0x1000000 + b;
  case 7:
    b = (uint)str_local[6] * 0x10000 + b;
  case 6:
    b = (uint)str_local[5] * 0x100 + b;
  case 5:
    b = str_local[4] + b;
  case 4:
    a = (uint)str_local[3] * 0x1000000 + a;
  case 3:
    a = (uint)str_local[2] * 0x10000 + a;
  case 2:
    a = (uint)str_local[1] * 0x100 + a;
  case 1:
    a = *str_local + a;
  default:
    uVar2 = c >> 0xd ^ (a - b) - c;
    uVar3 = uVar2 << 8 ^ (b - c) - uVar2;
    uVar4 = uVar3 >> 0xd ^ (c - uVar2) - uVar3;
    uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
    uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
    uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
    uVar2 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
    uVar3 = uVar2 << 10 ^ (uVar3 - uVar4) - uVar2;
    return uVar3 >> 0xf ^ (uVar4 - uVar2) - uVar3;
  }
}

Assistant:

static uint BOBHash32(const uchar* str, uint len, uint num = 0) {
		// register ub4 a,b,c,len;
		uint a, b, c;
		/* Set up the internal state */
		a = b = 0x9e3779b9;         /* the golden ratio; an arbitrary value */
		c = prime[num % MAX_PRIME]; /* the previous hash value */

		/*---------------------------------------- handle most of the key */
		while (len >= 12) {
			a += (str[0] + ((uint)str[1] << 8) + ((uint)str[2] << 16) +
				((uint)str[3] << 24));
			b += (str[4] + ((uint)str[5] << 8) + ((uint)str[6] << 16) +
				((uint)str[7] << 24));
			c += (str[8] + ((uint)str[9] << 8) + ((uint)str[10] << 16) +
				((uint)str[11] << 24));
			mix(a, b, c);
			str += 12;
			len -= 12;
		}

		/*------------------------------------- handle the last 11 bytes */
		c += len;
		switch (len) /* all the case statements fall through */
		{
		case 11:
			c += ((uint)str[10] << 24);
		case 10:
			c += ((uint)str[9] << 16);
		case 9:
			c += ((uint)str[8] << 8);
			/* the first byte of c is reserved for the length */
		case 8:
			b += ((uint)str[7] << 24);
		case 7:
			b += ((uint)str[6] << 16);
		case 6:
			b += ((uint)str[5] << 8);
		case 5:
			b += str[4];
		case 4:
			a += ((uint)str[3] << 24);
		case 3:
			a += ((uint)str[2] << 16);
		case 2:
			a += ((uint)str[1] << 8);
		case 1:
			a += str[0];
			/* case 0: nothing left to add */
		}
		mix(a, b, c);
		/*-------------------------------------------- report the result */
		return c;
	}